

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMI_RH_NV_AUTH_Unmarshal(TPMI_RH_NV_AUTH *target,BYTE **buffer,INT32 *size)

{
  uint uVar1;
  TPM_RC TVar2;
  
  TVar2 = UINT32_Unmarshal(target,buffer,size);
  if ((TVar2 == 0) &&
     (((uVar1 = *target, uVar1 == 0x40000001 || (uVar1 == 0x4000000c)) ||
      (TVar2 = 0x84, (uVar1 & 0xff000000) == 0x1000000)))) {
    TVar2 = 0;
  }
  return TVar2;
}

Assistant:

TPM_RC
TPMI_RH_NV_AUTH_Unmarshal(TPMI_RH_NV_AUTH *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_PLATFORM:
        case TPM_RH_OWNER:
            break;
        default:
            if((*target < NV_INDEX_FIRST) || (*target > NV_INDEX_LAST))
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}